

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_faceForward_vec3(ShaderEvalContext *c)

{
  Vector<float,_3> local_58;
  Vector<float,_3> local_4c;
  Vector<float,_3> local_40;
  tcu local_34 [12];
  VecAccess<float,_4,_3> local_28;
  
  local_40.m_data[0] = c->in[0].m_data[2];
  local_40.m_data._4_8_ = *(undefined8 *)c->in[0].m_data;
  local_58.m_data[2] = c->in[1].m_data[0];
  local_58.m_data._0_8_ = *(undefined8 *)(c->in[1].m_data + 1);
  local_4c.m_data[0] = c->in[2].m_data[3];
  local_4c.m_data._4_8_ = *(undefined8 *)(c->in[2].m_data + 1);
  tcu::faceForward<float,3>(local_34,&local_40,&local_58,&local_4c);
  local_28.m_vector = &c->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)local_34);
  return;
}

Assistant:

void eval_refract_float	(ShaderEvalContext& c) { c.color.x()	= refract(c.in[0].z(),                 c.in[1].x(),                 c.in[2].y()); }